

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  string *e;
  ulong uVar13;
  _Alloc_hider in_name;
  allocator<char> local_d1;
  string content;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  if (context == StripAllGeneratorExpressions) {
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    iVar12 = 0;
LAB_0029a0c0:
    lVar10 = std::__cxx11::string::find((char *)input,0x41a8f3);
    if (lVar10 != -1) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
      pcVar11 = (input->_M_dataplus)._M_p + lVar10 + 2;
      iVar12 = 1;
      do {
        cVar2 = *pcVar11;
        if (cVar2 == '$') {
          pcVar1 = pcVar11 + 1;
          if (*pcVar1 == '<') {
            pcVar11 = pcVar11 + 1;
          }
          iVar12 = iVar12 + (uint)(*pcVar1 == '<');
        }
        else if (cVar2 == '>') {
          iVar12 = iVar12 + -1;
          if (iVar12 == 0) {
            iVar12 = 0;
            goto LAB_0029a0c0;
          }
        }
        else if (cVar2 == '\0') goto LAB_0029a154;
        pcVar11 = pcVar11 + 1;
      } while( true );
    }
    if (iVar12 == 0) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
    }
    StripEmptyListElements(__return_storage_ptr__,&result);
    goto LAB_0029a1f2;
  }
  if (InstallInterface < context) {
    __assert_fail("false && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpression.cxx"
                  ,0x15a,
                  "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                 );
  }
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  iVar12 = 0;
  do {
    uVar7 = std::__cxx11::string::find((char *)input,0x41abf9);
    uVar8 = std::__cxx11::string::find((char *)input,0x4331fb);
    if ((uVar8 & uVar7) == 0xffffffffffffffff) {
      if (iVar12 == 0) {
        std::__cxx11::string::substr((ulong)&content,(ulong)input);
        std::__cxx11::string::append((string *)&result);
        std::__cxx11::string::~string((string *)&content);
      }
      StripEmptyListElements(__return_storage_ptr__,&result);
LAB_0029a1f2:
      std::__cxx11::string::~string((string *)&result);
      return __return_storage_ptr__;
    }
    uVar13 = uVar8;
    if (uVar7 < uVar8) {
      uVar13 = uVar7;
    }
    if (uVar8 == 0xffffffffffffffff) {
      uVar13 = uVar7;
    }
    if (uVar7 == 0xffffffffffffffff) {
      uVar13 = uVar8;
    }
    std::__cxx11::string::substr((ulong)&content,(ulong)input);
    std::__cxx11::string::append((string *)&result);
    std::__cxx11::string::~string((string *)&content);
    pcVar4 = (input->_M_dataplus)._M_p;
    cVar2 = pcVar4[uVar13 + 2];
    pcVar11 = pcVar4 + uVar13 + (ulong)(cVar2 == 'I') * 2 + 0x12;
    iVar12 = 1;
LAB_00299e1c:
    cVar3 = *pcVar11;
    if (cVar3 == '$') {
      pcVar1 = pcVar11 + 1;
      if (*pcVar1 == '<') {
        pcVar11 = pcVar11 + 1;
      }
      iVar12 = iVar12 + (uint)(*pcVar1 == '<');
LAB_00299e4c:
      pcVar11 = pcVar11 + 1;
      goto LAB_00299e1c;
    }
    if (cVar3 != '>') {
      if (cVar3 == '\0') goto LAB_00299fe0;
      goto LAB_00299e4c;
    }
    iVar12 = iVar12 + -1;
    if (iVar12 != 0) goto LAB_00299e4c;
    if ((context == BuildInterface) && (cVar2 != 'I')) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
    }
    else if ((context == InstallInterface) && (cVar2 == 'I')) {
      std::__cxx11::string::substr((ulong)&content,(ulong)input);
      if (resolveRelative) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"${_IMPORT_PREFIX}/",&local_d1);
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        Split(&content,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_58);
        sVar5 = local_58._M_string_length;
        for (in_name._M_p = local_58._M_dataplus._M_p; in_name._M_p != (pointer)sVar5;
            in_name._M_p = in_name._M_p + 0x20) {
          std::__cxx11::string::append((char *)&result);
          bVar6 = cmsys::SystemTools::FileIsFullPath((string *)in_name._M_p);
          if ((!bVar6) && (sVar9 = Find((string *)in_name._M_p), sVar9 != 0)) {
            std::__cxx11::string::append((string *)&result);
          }
          std::__cxx11::string::append((string *)&result);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        std::__cxx11::string::append((string *)&result);
      }
      std::__cxx11::string::~string((string *)&content);
    }
    iVar12 = 0;
    if (*pcVar11 == '\0') {
LAB_00299fe0:
      pcVar11 = "$<BUILD_INTERFACE:";
      if (cVar2 == 'I') {
        pcVar11 = "$<INSTALL_INTERFACE:";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar11,&local_d1);
      std::__cxx11::string::substr((ulong)&local_58,(ulong)input);
      std::operator+(&content,&local_78,&local_58);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&content);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  } while( true );
LAB_0029a154:
  std::__cxx11::string::substr((ulong)&local_78,(ulong)input);
  std::operator+(&content,"$<",&local_78);
  std::__cxx11::string::append((string *)&result);
  std::__cxx11::string::~string((string *)&content);
  std::__cxx11::string::~string((string *)&local_78);
  goto LAB_0029a0c0;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string& input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions) {
    return stripAllGeneratorExpressions(input);
  }
  if (context == BuildInterface || context == InstallInterface) {
    return stripExportInterface(input, context, resolveRelative);
  }

  assert(false &&
         "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}